

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<RCCFileInfo*>::
appendIteratorRange<QMultiHash<QString,RCCFileInfo*>::const_iterator>
          (QCommonArrayOps<RCCFileInfo*> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QMultiHash<QString,_RCCFileInfo_*>::const_iterator> param_3)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  const_iterator local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.e = b.e;
  local_48.i.d = b.i.d;
  local_48.i.bucket = b.i.bucket;
  while (local_48.e != e.e) {
    QMultiHash<QString,_RCCFileInfo_*>::const_iterator::operator++(&local_48);
  }
  puVar1 = (undefined8 *)(*(long *)(this + 0x10) * 8 + *(long *)(this + 8));
  while (b.e != e.e) {
    *puVar1 = (*b.e)->value;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    puVar1 = puVar1 + 1;
    QMultiHash<QString,_RCCFileInfo_*>::const_iterator::operator++(&b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }